

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::Builder::~Builder(Builder *this)

{
  int iVar1;
  _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *this_00;
  FileMetaData *pFVar2;
  pointer pcVar3;
  bool bVar4;
  Builder *pBVar5;
  _Base_ptr p_Var6;
  FileMetaData **ppFVar7;
  ulong uVar8;
  long lVar9;
  FileMetaData **ppFVar10;
  ulong uVar11;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> to_unref;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_58;
  Builder *local_38;
  
  lVar9 = 0;
  local_38 = this;
  do {
    this_00 = &(this->levels_[lVar9].added_files)->_M_t;
    local_58.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (FileMetaData **)0x0;
    local_58.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (FileMetaData **)0x0;
    local_58.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (FileMetaData **)0x0;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              (&local_58,(this_00->_M_impl).super__Rb_tree_header._M_node_count);
    for (p_Var6 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this_00->_M_impl).super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      if (local_58.
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
        _M_realloc_insert<leveldb::FileMetaData*const&>
                  ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                   &local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(FileMetaData **)(p_Var6 + 1));
      }
      else {
        *local_58.
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = *(FileMetaData **)(p_Var6 + 1);
        local_58.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    std::
    _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::~_Rb_tree(this_00);
    operator_delete(this_00);
    ppFVar10 = local_58.
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (local_58.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_58.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ppFVar7 = local_58.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar8 = 0;
      uVar11 = 1;
      do {
        pFVar2 = ppFVar10[uVar8];
        iVar1 = pFVar2->refs;
        pFVar2->refs = iVar1 + -1;
        if (iVar1 < 2) {
          pcVar3 = (pFVar2->largest).rep_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &(pFVar2->largest).rep_.field_2) {
            operator_delete(pcVar3);
          }
          pcVar3 = (pFVar2->smallest).rep_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &(pFVar2->smallest).rep_.field_2) {
            operator_delete(pcVar3);
          }
          operator_delete(pFVar2);
          ppFVar7 = local_58.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppFVar10 = local_58.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
        bVar4 = uVar11 < (ulong)((long)ppFVar7 - (long)ppFVar10 >> 3);
        uVar8 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar4);
    }
    if (ppFVar10 != (FileMetaData **)0x0) {
      operator_delete(ppFVar10);
    }
    pBVar5 = local_38;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 7);
  Version::Unref(local_38->base_);
  lVar9 = 0x160;
  do {
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)((long)pBVar5->levels_ + lVar9 + -0x10));
    lVar9 = lVar9 + -0x38;
  } while (lVar9 != -0x28);
  return;
}

Assistant:

~Builder() {
    for (int level = 0; level < config::kNumLevels; level++) {
      const FileSet* added = levels_[level].added_files;
      std::vector<FileMetaData*> to_unref;
      to_unref.reserve(added->size());
      for (FileSet::const_iterator it = added->begin(); it != added->end();
           ++it) {
        to_unref.push_back(*it);
      }
      delete added;
      for (uint32_t i = 0; i < to_unref.size(); i++) {
        FileMetaData* f = to_unref[i];
        f->refs--;
        if (f->refs <= 0) {
          delete f;
        }
      }
    }
    base_->Unref();
  }